

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_33386e4::TRDescriptor::ToStringSubScriptHelper
          (TRDescriptor *this,SigningProvider *arg,string *ret,StringType type,
          DescriptorCache *cache)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  pointer pDVar5;
  uint in_ECX;
  undefined8 in_RSI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  reference rVar6;
  size_t pos;
  vector<bool,_std::allocator<bool>_> path;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  char in_stack_fffffffffffffef7;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  _Bit_type in_stack_ffffffffffffff00;
  _Bit_type *in_stack_ffffffffffffff08;
  bool local_d9;
  ulong local_a8;
  byte local_71;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  if (bVar1) {
    local_71 = 1;
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffee8);
    rVar6._M_mask = in_stack_ffffffffffffff00;
    rVar6._M_p = in_stack_ffffffffffffff08;
    for (local_a8 = 0;
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8),
        local_a8 < sVar3; local_a8 = local_a8 + 1) {
      if (local_a8 != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef7);
      }
      while( true ) {
        sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)
                           CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                            CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
        if (*pvVar4 < (int)sVar3) break;
        sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)
                           CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        if (sVar3 != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                     in_stack_fffffffffffffef7);
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)rVar6._M_p,rVar6._M_mask._7_1_);
      }
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rVar6._M_mask)
      ;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
      ::operator[]((vector<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                   CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      pDVar5 = std::
               unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
               ::operator->((unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
                             *)in_stack_fffffffffffffee8);
      uVar2 = (*(pDVar5->super_Descriptor)._vptr_Descriptor[0x13])
                        (pDVar5,in_RSI,local_28,(ulong)in_ECX,in_R8);
      if ((uVar2 & 1) == 0) {
        local_71 = 0;
        bVar1 = true;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
        while( true ) {
          bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
          local_d9 = false;
          if (!bVar1) {
            std::vector<bool,_std::allocator<bool>_>::back
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
            local_d9 = std::_Bit_reference::operator_cast_to_bool
                                 ((_Bit_reference *)in_stack_fffffffffffffee8);
          }
          if (local_d9 == false) break;
          sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
          if (1 < sVar3) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                       in_stack_fffffffffffffef7);
          }
          std::vector<bool,_std::allocator<bool>_>::pop_back
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffee8);
        }
        bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                          ((vector<bool,_std::allocator<bool>_> *)
                           CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        if (!bVar1) {
          rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
          std::_Bit_reference::operator=
                    ((_Bit_reference *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)
                     ,(bool)in_stack_fffffffffffffef7);
        }
        bVar1 = false;
      }
      std::__cxx11::string::~string(in_stack_fffffffffffffee8);
      if (bVar1) goto LAB_019fa520;
    }
    local_71 = 1;
LAB_019fa520:
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffee8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_71 & 1);
}

Assistant:

bool ToStringSubScriptHelper(const SigningProvider* arg, std::string& ret, const StringType type, const DescriptorCache* cache = nullptr) const override
    {
        if (m_depths.empty()) return true;
        std::vector<bool> path;
        for (size_t pos = 0; pos < m_depths.size(); ++pos) {
            if (pos) ret += ',';
            while ((int)path.size() <= m_depths[pos]) {
                if (path.size()) ret += '{';
                path.push_back(false);
            }
            std::string tmp;
            if (!m_subdescriptor_args[pos]->ToStringHelper(arg, tmp, type, cache)) return false;
            ret += tmp;
            while (!path.empty() && path.back()) {
                if (path.size() > 1) ret += '}';
                path.pop_back();
            }
            if (!path.empty()) path.back() = true;
        }
        return true;
    }